

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>,-1,-1,false>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>,Eigen::DenseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
               *lhs,Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
                    *rhs,Scalar *alpha)

{
  double dVar1;
  Index IVar2;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>,_1,_1,false>const,1,_1,false>>
  *this;
  ScalarWithConstIfNotLvalue *pSVar3;
  ReturnType RVar4;
  undefined1 local_228 [8];
  RhsNested actual_rhs;
  LhsNested actual_lhs;
  ConstRowXpr local_c0;
  double *local_28;
  Scalar *alpha_local;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
  *rhs_local;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
  *lhs_local;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst_local;
  
  local_28 = alpha;
  alpha_local = (Scalar *)rhs;
  rhs_local = (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
               *)lhs;
  lhs_local = (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
               *)dst;
  IVar2 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_0>
          ::rows((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_0>
                  *)lhs);
  if ((IVar2 == 1) &&
     (IVar2 = MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>,_0>
              ::cols((MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_0>
                      *)alpha_local), IVar2 == 1)) {
    dVar1 = *local_28;
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>_>
    ::row(&local_c0,
          (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>_>
           *)rhs_local,0);
    this = (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>,_1,_1,false>const,1,_1,false>>
            *)DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_-1,_false>,_1,_-1,_false>_>
              ::conjugate((DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>,_1,__1,_false>_>
                           *)&local_c0);
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
    ::col((ConstColXpr *)
          &actual_lhs.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
           .m_outerStride,
          (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
           *)alpha_local,0);
    RVar4 = MatrixBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,true>,-1,-1,false>const,1,-1,false>>
            ::
            dot<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,_1,1,true>>
                      (this,(MatrixBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_true>_>
                             *)&actual_lhs.
                                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_Eigen::Dense>
                                .
                                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false,_true>
                                .m_outerStride);
    pSVar3 = MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::coeffRef((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
                         *)lhs_local,0,0);
    *pSVar3 = dVar1 * RVar4 + *pSVar3;
    return;
  }
  memcpy(&actual_rhs.
          super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
          .m_outerStride,rhs_local,0x68);
  memcpy(local_228,alpha_local,0x68);
  gemv_dense_selector<2,0,true>::
  run<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>,_1,_1,false>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,__1,_false>
              *)&actual_rhs.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false,_true>
                 .m_outerStride,
             (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>
              *)local_228,
             (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)lhs_local,
             local_28);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void scaleAndAddTo(Dest& dst, const Lhs& lhs, const Rhs& rhs, const Scalar& alpha)
  {
    // Fallback to inner product if both the lhs and rhs is a runtime vector.
    if (lhs.rows() == 1 && rhs.cols() == 1) {
      dst.coeffRef(0,0) += alpha * lhs.row(0).conjugate().dot(rhs.col(0));
      return;
    }
    LhsNested actual_lhs(lhs);
    RhsNested actual_rhs(rhs);
    internal::gemv_dense_selector<Side,
                            (int(MatrixType::Flags)&RowMajorBit) ? RowMajor : ColMajor,
                            bool(internal::blas_traits<MatrixType>::HasUsableDirectAccess)
                           >::run(actual_lhs, actual_rhs, dst, alpha);
  }